

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

bool IR::Instr::OpndHasAnyImplicitCalls(Opnd *opnd,bool isSrc)

{
  int iVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  bool bVar5;
  undefined4 *puVar6;
  long lVar7;
  long lVar8;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a;
  
  if (opnd != (Opnd *)0x0) {
    OVar3 = Opnd::GetKind(opnd);
    if (OVar3 == OpndKindSym) {
      OVar3 = Opnd::GetKind(opnd);
      if (OVar3 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar4) goto LAB_004c2376;
        *puVar6 = 0;
      }
      if (*(char *)((long)opnd[1]._vptr_Opnd + 0x14) == '\x02') {
        return true;
      }
    }
    OVar3 = Opnd::GetKind(opnd);
    if (OVar3 == OpndKindIndir) {
      return true;
    }
    if (isSrc) {
      local_2a = (opnd->m_valueType).field_0;
      bVar4 = ValueType::IsPrimitive((ValueType *)&local_2a.field_0);
      if (!bVar4) {
        return true;
      }
    }
    OVar3 = Opnd::GetKind(opnd);
    if (OVar3 == OpndKindList) {
      OVar3 = Opnd::GetKind(opnd);
      if (OVar3 != OpndKindList) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1a4,"(this->IsListOpnd())","Bad call to AsListOpnd()");
        if (!bVar4) {
LAB_004c2376:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      iVar1 = *(int *)&opnd[1]._vptr_Opnd;
      if (iVar1 < 1) {
        return 0 < iVar1;
      }
      bVar4 = OpndHasAnyImplicitCalls((Opnd *)**(undefined8 **)&opnd[1].m_valueType,isSrc);
      if (bVar4) {
        return 0 < iVar1;
      }
      lVar8 = 1;
      do {
        lVar7 = (long)*(int *)&opnd[1]._vptr_Opnd;
        bVar4 = lVar8 < lVar7;
        if (lVar7 <= lVar8) {
          return bVar4;
        }
        bVar5 = OpndHasAnyImplicitCalls(*(Opnd **)(*(long *)&opnd[1].m_valueType + lVar8 * 8),isSrc)
        ;
        lVar8 = lVar8 + 1;
      } while (!bVar5);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool Instr::OpndHasAnyImplicitCalls(IR::Opnd* opnd, bool isSrc)
{
    return opnd && (
        (opnd->IsSymOpnd() && opnd->AsSymOpnd()->m_sym->IsPropertySym()) ||
        opnd->IsIndirOpnd() ||
        (isSrc && !opnd->GetValueType().IsPrimitive()) ||
        (opnd->IsListOpnd() && opnd->AsListOpnd()->Any([isSrc](IR::Opnd* lOpnd) { return OpndHasAnyImplicitCalls(lOpnd, isSrc); }))
    );
}